

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

pair<Elf64_Sym,_unsigned_long> * __thiscall
pstack::Elf::Object::findDynamicSymbol
          (pair<Elf64_Sym,_unsigned_long> *__return_storage_ptr__,Object *this,string *name)

{
  uchar uVar1;
  uchar uVar2;
  Elf64_Section EVar3;
  Elf64_Addr EVar4;
  GnuHash *pGVar5;
  SymHash *pSVar6;
  pair<unsigned_int,_Elf64_Sym> local_58;
  undefined1 auStack_38 [8];
  Sym sym;
  
  pGVar5 = gnu_hash(this);
  if (pGVar5 == (GnuHash *)0x0) {
    pSVar6 = hash(this);
    if (pSVar6 == (SymHash *)0x0) {
      undef();
      goto LAB_00174d5e;
    }
    pSVar6 = hash(this);
    SymHash::findSymbol(&local_58,pSVar6,name);
  }
  else {
    pGVar5 = gnu_hash(this);
    GnuHash::findSymbol(&local_58,pGVar5,name);
  }
  auStack_38._0_4_ = local_58.second.st_name;
  auStack_38[4] = local_58.second.st_info;
  auStack_38[5] = local_58.second.st_other;
  auStack_38._6_2_ = local_58.second.st_shndx;
  sym.st_name = (undefined4)local_58.second.st_value;
  sym.st_info = local_58.second.st_value._4_1_;
  sym.st_other = local_58.second.st_value._5_1_;
  sym.st_shndx = local_58.second.st_value._6_2_;
  sym.st_value = local_58.second.st_size;
  if ((ulong)local_58.first != 0) {
    (__return_storage_ptr__->first).st_size = local_58.second.st_size;
    (__return_storage_ptr__->first).st_name = local_58.second.st_name;
    (__return_storage_ptr__->first).st_info = local_58.second.st_info;
    (__return_storage_ptr__->first).st_other = local_58.second.st_other;
    (__return_storage_ptr__->first).st_shndx = local_58.second.st_shndx;
    (__return_storage_ptr__->first).st_value = local_58.second.st_value;
    __return_storage_ptr__->second = (ulong)local_58.first;
    return __return_storage_ptr__;
  }
LAB_00174d5e:
  undef();
  EVar4 = undef::theUndef.undefSym.st_value;
  uVar1 = undef::theUndef.undefSym.st_info;
  uVar2 = undef::theUndef.undefSym.st_other;
  EVar3 = undef::theUndef.undefSym.st_shndx;
  (__return_storage_ptr__->first).st_name = undef::theUndef.undefSym.st_name;
  (__return_storage_ptr__->first).st_info = uVar1;
  (__return_storage_ptr__->first).st_other = uVar2;
  (__return_storage_ptr__->first).st_shndx = EVar3;
  (__return_storage_ptr__->first).st_value = EVar4;
  (__return_storage_ptr__->first).st_size = undef::theUndef.undefSym.st_size;
  __return_storage_ptr__->second = 0;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Sym, size_t>
Object::findDynamicSymbol(const std::string &name)
{
    Sym sym;
    uint32_t idx;

    std::tie(idx, sym) = gnu_hash() ? gnu_hash()->findSymbol(name)
             : hash() ? hash()->findSymbol(name)
             : std::make_pair(uint32_t(0), undef());

    if (idx == 0)
        return { undef() , 0 };

    // We found a symbol in our hash table. Find its version if we can.
    return {sym, idx};
}